

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O1

char * nghttp2_strerror(int error_code)

{
  switch(error_code) {
  case -0x219:
    return "SETTINGS frame contained more than the maximum allowed entries";
  case -0x218:
    return 
    "When a local endpoint expects to receive SETTINGS frame, it receives an other type of frame";
  case -0x217:
    return "Cancel";
  case -0x216:
    return "Internal error";
  case -0x215:
    return "Stream was refused";
  case -0x214:
    return "Violation in HTTP messaging rule";
  case -0x213:
    return "Invalid HTTP header field was received";
  case -0x212:
    return "The current session is closing";
  case -0x211:
    return "DATA or HEADERS frame has already been submitted for the stream";
  case -0x210:
    return "Server push is disabled by peer";
  case -0x20f:
    return "Too many inflight SETTINGS";
  case -0x20e:
    return "Callback was paused by the application";
  case -0x20d:
    return "Insufficient buffer size given to function";
  case -0x20c:
    return "Flow control error";
  case -0x20b:
    return "Header compression/decompression error";
  case -0x20a:
    return "The length of the frame is invalid";
  case -0x209:
    return "The user callback function failed due to the temporal error";
  case -0x208:
    goto switchD_00113bfa_caseD_fffffdf8;
  case -0x207:
    return "Invalid state";
  case -0x206:
    return "Invalid header block";
  case -0x205:
    return "GOAWAY has already been sent";
  case -0x204:
    return "request HEADERS is not allowed";
  case -0x203:
    return "Another DATA frame has already been deferred";
  case -0x202:
    return "Invalid stream state";
  case -0x201:
    return "Stream ID is invalid";
  case -0x200:
    return "The transmission is not allowed for this stream";
  case -0x1ff:
    return "Stream is closing";
  case -0x1fe:
    return "Stream was already closed or invalid";
  case -0x1fd:
    return "No more Stream ID available";
  case -0x1fc:
    return "Data transfer deferred";
  case -0x1fb:
    return "EOF";
  case -0x1fa:
    return "Invalid frame octets";
  case -0x1f9:
    return "Protocol error";
  case -0x1f8:
    return "Operation would block";
  case -0x1f7:
    return "Unsupported SPDY version";
  case -0x1f6:
    return "Out of buffer space";
  case -0x1f5:
    return "Invalid argument";
  default:
    switch(error_code) {
    case -0x389:
      return "Too many CONTINUATION frames following a HEADER frame";
    case -0x388:
      return "Flooding was detected in this HTTP/2 session, and it must be closed";
    case -0x387:
      return "Received bad client magic byte string";
    case -0x386:
      return "The user callback function failed";
    case -0x385:
      return "Out of memory";
    }
    if (error_code == 0) {
      return "Success";
    }
switchD_00113bfa_caseD_fffffdf8:
    return "Unknown error code";
  }
}

Assistant:

const char *nghttp2_strerror(int error_code) {
  switch (error_code) {
  case 0:
    return "Success";
  case NGHTTP2_ERR_INVALID_ARGUMENT:
    return "Invalid argument";
  case NGHTTP2_ERR_BUFFER_ERROR:
    return "Out of buffer space";
  case NGHTTP2_ERR_UNSUPPORTED_VERSION:
    return "Unsupported SPDY version";
  case NGHTTP2_ERR_WOULDBLOCK:
    return "Operation would block";
  case NGHTTP2_ERR_PROTO:
    return "Protocol error";
  case NGHTTP2_ERR_INVALID_FRAME:
    return "Invalid frame octets";
  case NGHTTP2_ERR_EOF:
    return "EOF";
  case NGHTTP2_ERR_DEFERRED:
    return "Data transfer deferred";
  case NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE:
    return "No more Stream ID available";
  case NGHTTP2_ERR_STREAM_CLOSED:
    return "Stream was already closed or invalid";
  case NGHTTP2_ERR_STREAM_CLOSING:
    return "Stream is closing";
  case NGHTTP2_ERR_STREAM_SHUT_WR:
    return "The transmission is not allowed for this stream";
  case NGHTTP2_ERR_INVALID_STREAM_ID:
    return "Stream ID is invalid";
  case NGHTTP2_ERR_INVALID_STREAM_STATE:
    return "Invalid stream state";
  case NGHTTP2_ERR_DEFERRED_DATA_EXIST:
    return "Another DATA frame has already been deferred";
  case NGHTTP2_ERR_START_STREAM_NOT_ALLOWED:
    return "request HEADERS is not allowed";
  case NGHTTP2_ERR_GOAWAY_ALREADY_SENT:
    return "GOAWAY has already been sent";
  case NGHTTP2_ERR_INVALID_HEADER_BLOCK:
    return "Invalid header block";
  case NGHTTP2_ERR_INVALID_STATE:
    return "Invalid state";
  case NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE:
    return "The user callback function failed due to the temporal error";
  case NGHTTP2_ERR_FRAME_SIZE_ERROR:
    return "The length of the frame is invalid";
  case NGHTTP2_ERR_HEADER_COMP:
    return "Header compression/decompression error";
  case NGHTTP2_ERR_FLOW_CONTROL:
    return "Flow control error";
  case NGHTTP2_ERR_INSUFF_BUFSIZE:
    return "Insufficient buffer size given to function";
  case NGHTTP2_ERR_PAUSE:
    return "Callback was paused by the application";
  case NGHTTP2_ERR_TOO_MANY_INFLIGHT_SETTINGS:
    return "Too many inflight SETTINGS";
  case NGHTTP2_ERR_PUSH_DISABLED:
    return "Server push is disabled by peer";
  case NGHTTP2_ERR_DATA_EXIST:
    return "DATA or HEADERS frame has already been submitted for the stream";
  case NGHTTP2_ERR_SESSION_CLOSING:
    return "The current session is closing";
  case NGHTTP2_ERR_HTTP_HEADER:
    return "Invalid HTTP header field was received";
  case NGHTTP2_ERR_HTTP_MESSAGING:
    return "Violation in HTTP messaging rule";
  case NGHTTP2_ERR_REFUSED_STREAM:
    return "Stream was refused";
  case NGHTTP2_ERR_INTERNAL:
    return "Internal error";
  case NGHTTP2_ERR_CANCEL:
    return "Cancel";
  case NGHTTP2_ERR_SETTINGS_EXPECTED:
    return "When a local endpoint expects to receive SETTINGS frame, it "
           "receives an other type of frame";
  case NGHTTP2_ERR_NOMEM:
    return "Out of memory";
  case NGHTTP2_ERR_CALLBACK_FAILURE:
    return "The user callback function failed";
  case NGHTTP2_ERR_BAD_CLIENT_MAGIC:
    return "Received bad client magic byte string";
  case NGHTTP2_ERR_FLOODED:
    return "Flooding was detected in this HTTP/2 session, and it must be "
           "closed";
  case NGHTTP2_ERR_TOO_MANY_SETTINGS:
    return "SETTINGS frame contained more than the maximum allowed entries";
  case NGHTTP2_ERR_TOO_MANY_CONTINUATIONS:
    return "Too many CONTINUATION frames following a HEADER frame";
  default:
    return "Unknown error code";
  }
}